

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPSCQueueBenchmark.cpp
# Opt level: O1

void pinThread(int cpu)

{
  int iVar1;
  int iVar2;
  pthread_t __th;
  int *piVar3;
  ostream *poVar4;
  size_t sVar5;
  undefined8 uVar6;
  __atomic_base<unsigned_long> _Var7;
  __atomic_base<unsigned_long> _Var8;
  long lVar9;
  long lVar10;
  cpu_set_t cpuset;
  long *plStack_398;
  long lStack_390;
  int iStack_384;
  undefined1 auStack_380 [128];
  ulong uStack_300;
  __atomic_base<unsigned_long> _Stack_2c0;
  size_t sStack_280;
  undefined1 auStack_240 [128];
  size_t sStack_1c0;
  __atomic_base<unsigned_long> _Stack_180;
  __atomic_base<unsigned_long> _Stack_140;
  cpu_set_t local_88;
  
  if (cpu < 0) {
    return;
  }
  local_88.__bits[0xe] = 0;
  local_88.__bits[0xf] = 0;
  local_88.__bits[0xc] = 0;
  local_88.__bits[0xd] = 0;
  local_88.__bits[10] = 0;
  local_88.__bits[0xb] = 0;
  local_88.__bits[8] = 0;
  local_88.__bits[9] = 0;
  local_88.__bits[6] = 0;
  local_88.__bits[7] = 0;
  local_88.__bits[4] = 0;
  local_88.__bits[5] = 0;
  local_88.__bits[2] = 0;
  local_88.__bits[3] = 0;
  local_88.__bits[0] = 0;
  local_88.__bits[1] = 0;
  if ((uint)cpu < 0x400) {
    local_88.__bits[(uint)cpu >> 6] = local_88.__bits[(uint)cpu >> 6] | 1L << ((byte)cpu & 0x3f);
  }
  __th = pthread_self();
  lVar9 = 0x80;
  iVar1 = pthread_setaffinity_np(__th,0x80,&local_88);
  iVar2 = (int)__th;
  if (iVar1 != -1) {
    return;
  }
  pinThread();
  iStack_384 = -1;
  lVar10 = 0xffffffff;
  if (iVar2 != 3) {
LAB_001025fa:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"SPSCQueue:",10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
    auStack_380._64_8_ = 0;
    uStack_300 = 0;
    _Stack_2c0._M_i = 0;
    sStack_280 = 0;
    auStack_380._0_8_ = 0x989681;
    auStack_380._8_8_ =
         __gnu_cxx::new_allocator<int>::allocate
                   ((new_allocator<int> *)auStack_380,0x9896a1,(void *)0x0);
    plStack_398 = (long *)0x0;
    auStack_240._0_8_ = operator_new(0x18);
    *(undefined ***)auStack_240._0_8_ = &PTR___State_00105cb8;
    *(int **)(auStack_240._0_8_ + 8) = &iStack_384;
    *(new_allocator<int> **)(auStack_240._0_8_ + 0x10) = (new_allocator<int> *)auStack_380;
    std::thread::_M_start_thread(&plStack_398,auStack_240,0);
    if (auStack_240._0_8_ != 0) {
      (**(code **)(*(long *)auStack_240._0_8_ + 8))();
    }
    iVar2 = (int)lVar10;
    pinThread(iVar2);
    iVar1 = 0;
    std::chrono::_V2::steady_clock::now();
    do {
      _Var8._M_i = uStack_300;
      _Var7._M_i = 0;
      if (auStack_380._64_8_ + 1 != auStack_380._0_8_) {
        _Var7._M_i = auStack_380._64_8_ + 1;
      }
      do {
        uStack_300 = _Var8._M_i;
        _Var8._M_i = _Stack_2c0._M_i;
      } while (_Var7._M_i == uStack_300);
      *(int *)(auStack_380._8_8_ + (auStack_380._64_8_ + 0x10) * 4) = iVar1;
      iVar1 = iVar1 + 1;
      auStack_380._64_8_ = _Var7._M_i;
    } while (iVar1 != 10000000);
    std::thread::join();
    std::chrono::_V2::steady_clock::now();
    poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ops/ms",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if (plStack_398 == (long *)0x0) {
      rigtorp::SPSCQueue<int,_std::allocator<int>_>::~SPSCQueue
                ((SPSCQueue<int,_std::allocator<int>_> *)auStack_380);
      auStack_380._64_8_ = 0;
      uStack_300 = 0;
      _Stack_2c0._M_i = 0;
      sStack_280 = 0;
      auStack_380._0_8_ = 0x989681;
      auStack_380._8_8_ =
           __gnu_cxx::new_allocator<int>::allocate
                     ((new_allocator<int> *)auStack_380,0x9896a1,(void *)0x0);
      auStack_240._64_8_ = 0;
      sStack_1c0 = 0;
      _Stack_180._M_i = 0;
      _Stack_140._M_i = 0;
      auStack_240._0_8_ = 0x989681;
      auStack_240._8_8_ =
           __gnu_cxx::new_allocator<int>::allocate
                     ((new_allocator<int> *)auStack_240,0x9896a1,(void *)0x0);
      lStack_390 = 0;
      plStack_398 = (long *)operator_new(0x20);
      *plStack_398 = (long)&PTR___State_00105cf8;
      plStack_398[1] = (long)&iStack_384;
      plStack_398[2] = (long)auStack_380;
      plStack_398[3] = (long)auStack_240;
      std::thread::_M_start_thread(&lStack_390,&plStack_398,0);
      if (plStack_398 != (long *)0x0) {
        (**(code **)(*plStack_398 + 8))();
      }
      pinThread(iVar2);
      iVar1 = 0;
      std::chrono::_V2::steady_clock::now();
      do {
        _Var8._M_i = uStack_300;
        _Var7._M_i = 0;
        if (auStack_380._64_8_ + 1 != auStack_380._0_8_) {
          _Var7._M_i = auStack_380._64_8_ + 1;
        }
        do {
          uStack_300 = _Var8._M_i;
          _Var8._M_i = _Stack_2c0._M_i;
        } while (_Var7._M_i == uStack_300);
        *(int *)(auStack_380._8_8_ + (auStack_380._64_8_ + 0x10) * 4) = iVar1;
        do {
          while (_Stack_180._M_i != _Stack_140._M_i) {
            if ((int *)(auStack_240._8_8_ + _Stack_180._M_i * 4) != (int *)0xffffffffffffffc0)
            goto LAB_0010293d;
          }
          _Stack_140._M_i = auStack_240._64_8_;
        } while ((auStack_240._64_8_ == _Stack_180._M_i) ||
                ((int *)(auStack_240._8_8_ + _Stack_180._M_i * 4) == (int *)0xffffffffffffffc0));
LAB_0010293d:
        auStack_380._64_8_ = _Var7._M_i;
        rigtorp::SPSCQueue<int,_std::allocator<int>_>::pop
                  ((SPSCQueue<int,_std::allocator<int>_> *)auStack_240);
        iVar1 = iVar1 + 1;
      } while (iVar1 != 10000000);
      std::chrono::_V2::steady_clock::now();
      std::thread::join();
      poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ns RTT",7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if (lStack_390 == 0) {
        rigtorp::SPSCQueue<int,_std::allocator<int>_>::~SPSCQueue
                  ((SPSCQueue<int,_std::allocator<int>_> *)auStack_240);
        rigtorp::SPSCQueue<int,_std::allocator<int>_>::~SPSCQueue
                  ((SPSCQueue<int,_std::allocator<int>_> *)auStack_380);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"boost::lockfree::spsc:",0x16);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
        std::ostream::put(-0x18);
        std::ostream::flush();
        auStack_380._0_8_ = 0;
        auStack_380._64_8_ = 0;
        auStack_380._72_8_ = 0x989681;
        auStack_380._80_8_ = operator_new(0x2625a04);
        plStack_398 = (long *)0x0;
        auStack_240._0_8_ = operator_new(0x18);
        *(undefined ***)auStack_240._0_8_ = &PTR___State_00105d38;
        *(int **)(auStack_240._0_8_ + 8) = &iStack_384;
        *(SPSCQueue<int,_std::allocator<int>_> **)(auStack_240._0_8_ + 0x10) =
             (SPSCQueue<int,_std::allocator<int>_> *)auStack_380;
        std::thread::_M_start_thread(&plStack_398,auStack_240,0);
        if (auStack_240._0_8_ != 0) {
          (**(code **)(*(long *)auStack_240._0_8_ + 8))();
        }
        pinThread(iVar2);
        iVar1 = 0;
        std::chrono::_V2::steady_clock::now();
        do {
          do {
            _Var8._M_i = auStack_380._72_8_ + auStack_380._0_8_ + 1;
            do {
              _Var8._M_i = _Var8._M_i - auStack_380._72_8_;
            } while ((ulong)auStack_380._72_8_ <= _Var8._M_i);
          } while (auStack_380._64_8_ == _Var8._M_i);
          *(int *)(auStack_380._80_8_ + auStack_380._0_8_ * 4) = iVar1;
          iVar1 = iVar1 + 1;
          auStack_380._0_8_ = _Var8._M_i;
        } while (iVar1 != 10000000);
        std::thread::join();
        std::chrono::_V2::steady_clock::now();
        poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ops/ms",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        if (plStack_398 == (long *)0x0) {
          boost::lockfree::detail::runtime_sized_ringbuffer<int,_std::allocator<int>_>::
          ~runtime_sized_ringbuffer
                    ((runtime_sized_ringbuffer<int,_std::allocator<int>_> *)auStack_380);
          auStack_380._0_8_ = 0;
          auStack_380._64_8_ = 0;
          auStack_380._72_8_ = 0x989681;
          auStack_380._80_8_ = operator_new(0x2625a04);
          auStack_240._0_8_ = 0;
          auStack_240._64_8_ = 0;
          auStack_240._72_8_ = 0x989681;
          auStack_240._80_8_ = operator_new(0x2625a04);
          lStack_390 = 0;
          plStack_398 = (long *)operator_new(0x20);
          *plStack_398 = (long)&PTR___State_00105d78;
          plStack_398[1] = (long)&iStack_384;
          plStack_398[2] = (long)auStack_380;
          plStack_398[3] = (long)auStack_240;
          std::thread::_M_start_thread(&lStack_390,&plStack_398,0);
          if (plStack_398 != (long *)0x0) {
            (**(code **)(*plStack_398 + 8))();
          }
          pinThread(iVar2);
          iVar1 = 0;
          std::chrono::_V2::steady_clock::now();
          do {
            do {
              _Var8._M_i = auStack_380._72_8_ + auStack_380._0_8_ + 1;
              do {
                _Var8._M_i = _Var8._M_i - auStack_380._72_8_;
              } while ((ulong)auStack_380._72_8_ <= _Var8._M_i);
            } while (auStack_380._64_8_ == _Var8._M_i);
            *(int *)(auStack_380._80_8_ + auStack_380._0_8_ * 4) = iVar1;
            auStack_380._0_8_ = _Var8._M_i;
            do {
              sVar5 = boost::lockfree::detail::ringbuffer_base<int>::pop
                                ((ringbuffer_base<int> *)auStack_240,(int *)&plStack_398,1,
                                 (int *)auStack_240._80_8_,auStack_240._72_8_);
            } while (sVar5 != 1);
            iVar1 = iVar1 + 1;
          } while (iVar1 != 10000000);
          std::chrono::_V2::steady_clock::now();
          std::thread::join();
          poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ns RTT",7);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          if (lStack_390 == 0) {
            boost::lockfree::detail::runtime_sized_ringbuffer<int,_std::allocator<int>_>::
            ~runtime_sized_ringbuffer
                      ((runtime_sized_ringbuffer<int,_std::allocator<int>_> *)auStack_240);
            boost::lockfree::detail::runtime_sized_ringbuffer<int,_std::allocator<int>_>::
            ~runtime_sized_ringbuffer
                      ((runtime_sized_ringbuffer<int,_std::allocator<int>_> *)auStack_380);
            return;
          }
        }
      }
    }
    std::terminate();
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_380,*(char **)(lVar9 + 8),(allocator<char> *)&plStack_398);
  uVar6 = auStack_380._0_8_;
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  *piVar3 = 0;
  lVar10 = strtol((char *)uVar6,(char **)auStack_240,10);
  if (auStack_240._0_8_ == uVar6) {
    std::__throw_invalid_argument("stoi");
LAB_00102d7c:
    std::__throw_out_of_range("stoi");
  }
  else {
    iVar2 = (int)lVar10;
    if ((iVar2 != lVar10) || (*piVar3 == 0x22)) goto LAB_00102d7c;
    if (*piVar3 == 0) {
      *piVar3 = iVar1;
    }
    iStack_384 = iVar2;
    if (auStack_380._0_8_ != (long)auStack_380 + 0x10U) {
      operator_delete((void *)auStack_380._0_8_,auStack_380._16_8_ + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)auStack_380,*(char **)(lVar9 + 0x10),(allocator<char> *)&plStack_398);
    uVar6 = auStack_380._0_8_;
    iVar1 = *piVar3;
    *piVar3 = 0;
    lVar10 = strtol((char *)auStack_380._0_8_,(char **)auStack_240,10);
    if (auStack_240._0_8_ != uVar6) {
      if ((0xfffffffeffffffff < lVar10 - 0x80000000U) && (*piVar3 != 0x22)) {
        if (*piVar3 == 0) {
          *piVar3 = iVar1;
        }
        if (auStack_380._0_8_ != (long)auStack_380 + 0x10U) {
          operator_delete((void *)auStack_380._0_8_,auStack_380._16_8_ + 1);
        }
        goto LAB_001025fa;
      }
      goto LAB_00102d94;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_00102d94:
  uVar6 = std::__throw_out_of_range("stoi");
  _Unwind_Resume(uVar6);
}

Assistant:

void pinThread(int cpu) {
  if (cpu < 0) {
    return;
  }
  cpu_set_t cpuset;
  CPU_ZERO(&cpuset);
  CPU_SET(cpu, &cpuset);
  if (pthread_setaffinity_np(pthread_self(), sizeof(cpu_set_t), &cpuset) ==
      -1) {
    perror("pthread_setaffinity_no");
    exit(1);
  }
}